

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::push_float(PrintC *this,uintb val,int4 sz,Varnode *vn,PcodeOp *op)

{
  uint *puVar1;
  bool bVar2;
  FloatFormat *this_00;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  double dVar6;
  floatclass type;
  ostringstream t;
  string local_1f0;
  Atom local_1d0;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  this_00 = Translate::getFloatFormat(((this->super_PrintLanguage).glb)->translate,sz);
  if (this_00 == (FloatFormat *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"FLOAT_UNKNOWN",0xd);
  }
  else {
    dVar6 = FloatFormat::getHostFloat(this_00,val,(floatclass *)&local_1d0);
    if ((int)local_1d0.name == 3) {
      bVar2 = FloatFormat::extractSign(this_00,val);
      lVar4 = 3;
      pcVar5 = "NAN";
      if (bVar2) {
        local_1f0._M_dataplus._M_p._0_1_ = 0x2d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)&local_1f0,1);
      }
    }
    else {
      if ((int)local_1d0.name != 1) {
        uVar3 = 0x100;
        if (((this->super_PrintLanguage).mods & 8) == 0) {
          uVar3 = 4;
        }
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
        *puVar1 = *puVar1 | uVar3;
        *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 8;
        std::ostream::_M_insert<double>(dVar6);
        goto LAB_00303057;
      }
      bVar2 = FloatFormat::extractSign(this_00,val);
      lVar4 = 8;
      pcVar5 = "INFINITY";
      if (bVar2) {
        local_1f0._M_dataplus._M_p._0_1_ = 0x2d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)&local_1f0,1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar5,lVar4);
  }
LAB_00303057:
  local_1d0.op = op;
  if (vn == (Varnode *)0x0) {
    std::__cxx11::stringbuf::str();
    local_1d0.type = syntax;
    local_1d0.highlight = const_color;
    local_1d0.name = &local_1f0;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_1d0);
  }
  else {
    std::__cxx11::stringbuf::str();
    local_1d0.type = vartoken;
    local_1d0.highlight = const_color;
    local_1d0.name = &local_1f0;
    local_1d0.ptr_second.vn = vn;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
      &local_1f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void PrintC::push_float(uintb val,int4 sz,const Varnode *vn,const PcodeOp *op)
{
  ostringstream t;

  const FloatFormat *format = glb->translate->getFloatFormat(sz);
  if (format == (const FloatFormat *)0) {
    t << "FLOAT_UNKNOWN";
  }
  else {
    FloatFormat::floatclass type;
    double floatval = format->getHostFloat(val,&type);
    if (type == FloatFormat::infinity) {
      if (format->extractSign(val))
	t << '-';
      t << "INFINITY";
    }
    else if (type == FloatFormat::nan) {
      if (format->extractSign(val))
	t << '-';
      t << "NAN";
    }
    else {
      if ((mods & force_scinote)!=0)
	t.setf( ios::scientific ); // Set to scientific notation
      else
	t.setf( ios::fixed );	// Otherwise use fixed notation
      t.precision(8);		// Number of digits of precision
      t << floatval;
    }
  }
  if (vn==(const Varnode *)0)
    pushAtom(Atom(t.str(),syntax,EmitXml::const_color,op));
  else
    pushAtom(Atom(t.str(),vartoken,EmitXml::const_color,op,vn));
}